

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O3

void __thiscall sf::priv::WindowImplX11::processEvents(WindowImplX11 *this)

{
  int iVar1;
  XEvent event;
  XEvent nextEvent;
  XEvent local_1a0;
  int local_e0 [14];
  ulong local_a8;
  uint local_8c;
  
  iVar1 = XCheckIfEvent(this->m_display,&local_1a0,
                        anon_unknown.dwarf_2ff977::WindowsImplX11Impl::checkEvent,this->m_window);
  if (iVar1 != 0) {
LAB_00198d36:
    do {
      if (local_1a0.type == 3) {
        iVar1 = XCheckIfEvent(this->m_display,local_e0,
                              anon_unknown.dwarf_2ff977::WindowsImplX11Impl::checkEvent,
                              this->m_window);
        if (iVar1 == 0) goto LAB_00198dcb;
        if (((local_e0[0] != 2) || (local_8c != local_1a0.xkey.keycode)) ||
           (local_1a0.xkey.time + 1 < local_a8 || local_a8 < local_1a0.xkey.time)) {
          processEvent(this,&local_1a0);
          memcpy(&local_1a0,local_e0,0xc0);
          goto LAB_00198d36;
        }
        if (this->m_keyRepeat == true) {
          memcpy(&local_1a0,local_e0,0xc0);
          goto LAB_00198dcb;
        }
      }
      else {
LAB_00198dcb:
        processEvent(this,&local_1a0);
      }
      iVar1 = XCheckIfEvent(this->m_display,&local_1a0,
                            anon_unknown.dwarf_2ff977::WindowsImplX11Impl::checkEvent,this->m_window
                           );
    } while (iVar1 != 0);
  }
  ClipboardImpl::processEvents();
  return;
}

Assistant:

void WindowImplX11::processEvents()
{
    using namespace WindowsImplX11Impl;

    XEvent event;

    // Pick out the events that are interesting for this window
    while (XCheckIfEvent(m_display, &event, &checkEvent, reinterpret_cast<XPointer>(m_window)))
    {
        // This function implements a workaround to properly discard
        // repeated key events when necessary. The problem is that the
        // system's key events policy doesn't match SFML's one: X server will generate
        // both repeated KeyPress and KeyRelease events when maintaining a key down, while
        // SFML only wants repeated KeyPress events. Thus, we have to:
        // - Discard duplicated KeyRelease events when m_keyRepeat is true
        // - Discard both duplicated KeyPress and KeyRelease events when m_keyRepeat is false

        bool processThisEvent = true;

        // Detect repeated key events
        while (event.type == KeyRelease)
        {
            XEvent nextEvent;
            if (XCheckIfEvent(m_display, &nextEvent, checkEvent, reinterpret_cast<XPointer>(m_window)))
            {
                if ((nextEvent.type == KeyPress) && (nextEvent.xkey.keycode == event.xkey.keycode) &&
                    (event.xkey.time <= nextEvent.xkey.time) && (nextEvent.xkey.time <= event.xkey.time + 1))
                {
                    // This sequence of events comes from maintaining a key down
                    if (m_keyRepeat)
                    {
                        // Ignore the KeyRelease event and process the KeyPress event
                        event = nextEvent;
                        break;
                    }
                    else
                    {
                        // Ignore both events
                        processThisEvent = false;
                        break;
                    }
                }
                else
                {
                    // This sequence of events does not come from maintaining a key down,
                    // so process the KeyRelease event normally,
                    processEvent(event);
                    // but loop because the next event can be the first half
                    // of a sequence coming from maintaining a key down.
                    event = nextEvent;
                }
            }
            else
            {
                // No event after this KeyRelease event so assume it can be processed.
                break;
            }
        }

        if (processThisEvent)
        {
            processEvent(event);
        }
    }

    // Process clipboard window events
    priv::ClipboardImpl::processEvents();
}